

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O2

void __thiscall helics::apps::BrokerServer::startServers(BrokerServer *this)

{
  string *psVar1;
  pointer psVar2;
  element_type *peVar3;
  undefined8 __p;
  size_type sVar4;
  element_type *peVar5;
  pointer pcVar6;
  shared_ptr<helics::apps::TypedBrokerServer> *server;
  pointer psVar7;
  shared_ptr<helics::apps::zmqBrokerServer> zmqs;
  undefined1 local_28 [16];
  
  if ((this->configFile_)._M_string_length == 0) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&zmqs,(nullptr_t)0x0);
    std::
    make_unique<helics::fileops::JsonStorage,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_28);
  }
  else {
    fileops::loadJson((fileops *)&zmqs,(string *)&this->configFile_);
    std::
    make_unique<helics::fileops::JsonStorage,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_28);
  }
  __p = local_28._0_8_;
  local_28._0_8_ = (element_type *)0x0;
  CLI::std::
  __uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
  ::reset((__uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
           *)&this->config_,(pointer)__p);
  CLI::std::
  unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>::
  ~unique_ptr((unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
               *)local_28);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)&zmqs);
  if ((this->zmq_server != false) || (this->zmq_ss_server == true)) {
    std::make_shared<helics::apps::zmqBrokerServer,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&zmqs);
    if (this->zmq_server == true) {
      (zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      zmq_enabled_ = true;
    }
    if (this->zmq_ss_server == true) {
      (zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      zmqss_enabled_ = true;
    }
    sVar4 = (this->mZmqArgs)._M_string_length;
    peVar5 = zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (sVar4 != 0) {
      (*((zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                (zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,sVar4,(this->mZmqArgs)._M_dataplus._M_p);
      peVar5 = zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    local_28._8_8_ =
         zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_28._0_8_ = peVar5;
    std::
    vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
    ::emplace_back<std::shared_ptr<helics::apps::TypedBrokerServer>>
              ((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
                *)&this->servers,(shared_ptr<helics::apps::TypedBrokerServer> *)local_28);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if ((this->tcp_server != false) || (this->udp_server == true)) {
    std::make_shared<helics::apps::AsioBrokerServer,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&zmqs);
    if (this->tcp_server == true) {
      zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
      threadGuard.super___mutex_base._M_mutex.__size[0x18] = '\x01';
      sVar4 = (this->mTcpArgs)._M_string_length;
      if (sVar4 != 0) {
        (*((zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                  (zmqs.
                   super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,sVar4,(this->mTcpArgs)._M_dataplus._M_p);
      }
    }
    peVar5 = zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (this->udp_server == true) {
      zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
      threadGuard.super___mutex_base._M_mutex.__size[0x19] = '\x01';
      sVar4 = (this->mUdpArgs)._M_string_length;
      if (sVar4 != 0) {
        (*((zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                  (zmqs.
                   super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,sVar4,(this->mUdpArgs)._M_dataplus._M_p);
        peVar5 = zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      }
    }
    local_28._8_8_ =
         zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_28._0_8_ = peVar5;
    std::
    vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
    ::emplace_back<std::shared_ptr<helics::apps::TypedBrokerServer>>
              ((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
                *)&this->servers,(shared_ptr<helics::apps::TypedBrokerServer> *)local_28);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if ((this->http_server != false) || (this->websocket_server == true)) {
    std::make_shared<helics::apps::WebServer,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&zmqs);
    if ((this->http_server == true) &&
       (zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
        .name_.field_2._M_local_buf[0xc] = '\x01', (this->mHttpArgs)._M_string_length != 0)) {
      psVar1 = &this->mHttpArgs;
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_not_of(psVar1,' ',0);
      pcVar6 = (psVar1->_M_dataplus)._M_p;
      if ((sVar4 != 0xffffffffffffffff) && (pcVar6[sVar4] == '-')) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (psVar1,0,"http ",5);
        pcVar6 = (psVar1->_M_dataplus)._M_p;
      }
      (*((zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                (zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(this->mHttpArgs)._M_string_length,pcVar6);
    }
    peVar5 = zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((this->websocket_server == true) &&
       (zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
        .name_.field_2._M_local_buf[0xd] = '\x01', (this->mWebSocketArgs)._M_string_length != 0)) {
      psVar1 = &this->mWebSocketArgs;
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_not_of(psVar1,' ',0);
      pcVar6 = (psVar1->_M_dataplus)._M_p;
      if ((sVar4 != 0xffffffffffffffff) && (pcVar6[sVar4] == '-')) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (psVar1,0,"websocket ",10);
        pcVar6 = (psVar1->_M_dataplus)._M_p;
      }
      (*((zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                (zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(this->mWebSocketArgs)._M_string_length,pcVar6);
      peVar5 = zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    local_28._8_8_ =
         zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_28._0_8_ = peVar5;
    std::
    vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
    ::emplace_back<std::shared_ptr<helics::apps::TypedBrokerServer>>
              ((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
                *)&this->servers,(shared_ptr<helics::apps::TypedBrokerServer> *)local_28);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&zmqs.super___shared_ptr<helics::apps::zmqBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  psVar2 = (this->servers).
           super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar7 = (this->servers).
                super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar2; psVar7 = psVar7 + 1) {
    peVar3 = (psVar7->
             super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    (*peVar3->_vptr_TypedBrokerServer[2])
              (peVar3,(this->config_)._M_t.
                      super___uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::fileops::JsonStorage_*,_std::default_delete<helics::fileops::JsonStorage>_>
                      .super__Head_base<0UL,_helics::fileops::JsonStorage_*,_false>._M_head_impl,
               psVar7);
  }
  return;
}

Assistant:

void BrokerServer::startServers()
{
    if (!configFile_.empty()) {
        config_ = std::make_unique<fileops::JsonStorage>(fileops::loadJson(configFile_));
    } else {
        config_ = std::make_unique<fileops::JsonStorage>(nlohmann::json());
    }
    if (zmq_server || zmq_ss_server) {
        auto zmqs = std::make_shared<zmqBrokerServer>(server_name_);
        if (zmq_server) {
            zmqs->enableZmqServer(true);
        }
        if (zmq_ss_server) {
            zmqs->enableZmqSsServer(true);
        }
        if (!mZmqArgs.empty()) {
            zmqs->processArgs(mZmqArgs);
        }
        servers.push_back(std::move(zmqs));
    }
    if (tcp_server || udp_server) {
        auto asios = std::make_shared<AsioBrokerServer>(server_name_);
        if (tcp_server) {
            asios->enableTcpServer(true);
            if (!mTcpArgs.empty()) {
                asios->processArgs(mTcpArgs);
            }
        }
        if (udp_server) {
            asios->enableUdpServer(true);
            if (!mUdpArgs.empty()) {
                asios->processArgs(mUdpArgs);
            }
        }
        servers.push_back(std::move(asios));
    }

    if (http_server || websocket_server) {
#ifdef HELICS_ENABLE_WEBSERVER
        auto webs = std::make_shared<WebServer>(server_name_);
        if (http_server) {
            webs->enableHttpServer(true);
            if (!mHttpArgs.empty()) {
                auto fc = mHttpArgs.find_first_not_of(' ');
                if (fc != std::string::npos) {
                    if (mHttpArgs[fc] == '-') {
                        mHttpArgs.insert(0, "http ", 5);
                    }
                }

                webs->processArgs(mHttpArgs);
            }
        }
        if (websocket_server) {
            webs->enableWebSocketServer(true);
            if (!mWebSocketArgs.empty()) {
                auto fc = mWebSocketArgs.find_first_not_of(' ');
                if (fc != std::string::npos) {
                    if (mWebSocketArgs[fc] == '-') {
                        mWebSocketArgs.insert(0, "websocket ", 10);
                    }
                }
                webs->processArgs(mWebSocketArgs);
            }
        }
        servers.push_back(std::move(webs));
#else
        std::cout << "Webserver not enabled" << std::endl;
#endif
    }
    for (auto& server : servers) {
        server->startServer(&config_->json(), server);
    }
}